

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O0

_Bool plutovg_skip_ws_or_delim(char **begin,char *end,char delim,_Bool *has_delim)

{
  char *pcVar1;
  _Bool _Var2;
  char *local_38;
  char *it;
  _Bool *has_delim_local;
  char *pcStack_20;
  char delim_local;
  char *end_local;
  char **begin_local;
  
  local_38 = *begin;
  if (has_delim != (_Bool *)0x0) {
    *has_delim = false;
  }
  it = has_delim;
  has_delim_local._7_1_ = delim;
  pcStack_20 = end;
  end_local = (char *)begin;
  _Var2 = plutovg_skip_ws(&local_38,end);
  if ((_Var2) && (_Var2 = plutovg_skip_delim(&local_38,pcStack_20,has_delim_local._7_1_), _Var2)) {
    if (it != (char *)0x0) {
      *it = '\x01';
    }
    plutovg_skip_ws(&local_38,pcStack_20);
  }
  pcVar1 = *(char **)end_local;
  if (local_38 != pcVar1) {
    *(char **)end_local = local_38;
  }
  begin_local._7_1_ = local_38 != pcVar1 && local_38 < pcStack_20;
  return begin_local._7_1_;
}

Assistant:

static inline bool plutovg_skip_ws_or_delim(const char** begin, const char* end, char delim, bool* has_delim)
{
    const char* it = *begin;
    if(has_delim)
        *has_delim = false;
    if(plutovg_skip_ws(&it, end)) {
        if(plutovg_skip_delim(&it, end, delim)) {
            if(has_delim)
                *has_delim = true;
            plutovg_skip_ws(&it, end);
        }
    }

    if(it == *begin)
        return false;
    *begin = it;
    return it < end;
}